

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

void text_undo(spng_ctx *ctx)

{
  spng_text2 *psVar1;
  ulong uVar2;
  uint uVar3;
  
  psVar1 = ctx->text_list;
  uVar3 = ctx->n_text - 1;
  (*(ctx->alloc).free_fn)(psVar1[uVar3].keyword);
  if (psVar1[uVar3].compression_flag != '\0') {
    (*(ctx->alloc).free_fn)(psVar1[uVar3].text);
  }
  if (((ctx != (spng_ctx *)0x0) && (uVar2 = psVar1[uVar3].cache_usage, uVar2 != 0)) &&
     (uVar2 <= ctx->chunk_cache_usage)) {
    ctx->chunk_cache_usage = ctx->chunk_cache_usage - uVar2;
  }
  if ((ctx != (spng_ctx *)0x0) && (0x8f < ctx->chunk_cache_usage)) {
    ctx->chunk_cache_usage = ctx->chunk_cache_usage - 0x90;
  }
  psVar1[uVar3].keyword = (char *)0x0;
  psVar1[uVar3].text = (char *)0x0;
  ctx->n_text = ctx->n_text - 1;
  return;
}

Assistant:

static void text_undo(spng_ctx *ctx)
{
    struct spng_text2 *text = &ctx->text_list[ctx->n_text - 1];

    spng__free(ctx, text->keyword);
    if(text->compression_flag) spng__free(ctx, text->text);

    decrease_cache_usage(ctx, text->cache_usage);
    decrease_cache_usage(ctx, sizeof(struct spng_text2));

    text->keyword = NULL;
    text->text = NULL;

    ctx->n_text--;
}